

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<int,_QByteArray>_>::freeData
          (Span<QHashPrivate::Node<int,_QByteArray>_> *this)

{
  long lVar1;
  
  if (*(long *)(this + 0x80) != 0) {
    for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 1) {
      if (this[lVar1] != (Span<QHashPrivate::Node<int,_QByteArray>_>)0xff) {
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   (*(long *)(this + 0x80) + (ulong)(byte)this[lVar1] * 0x20 + 8));
      }
    }
    if (*(void **)(this + 0x80) != (void *)0x0) {
      operator_delete__(*(void **)(this + 0x80));
    }
    *(undefined8 *)(this + 0x80) = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }